

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

double __thiscall
duckdb::Interpolator<false>::Extract<duckdb::hugeint_t,double>
          (Interpolator<false> *this,hugeint_t *dest,Vector *result)

{
  undefined8 uVar1;
  hugeint_t *in_RDX;
  long in_RDI;
  Vector *result_00;
  undefined1 auVar2 [16];
  double hi;
  double lo;
  double local_30;
  Vector *in_stack_ffffffffffffffd8;
  double local_8;
  
  if (*(long *)(in_RDI + 0x18) == *(long *)(in_RDI + 0x10)) {
    local_8 = CastInterpolation::Cast<duckdb::hugeint_t,double>(in_RDX,in_stack_ffffffffffffffd8);
  }
  else {
    result_00 = (Vector *)
                CastInterpolation::Cast<duckdb::hugeint_t,double>(in_RDX,in_stack_ffffffffffffffd8);
    local_30 = CastInterpolation::Cast<duckdb::hugeint_t,double>(in_RDX,result_00);
    uVar1 = *(undefined8 *)(in_RDI + 0x10);
    auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = CastInterpolation::Interpolate<double>
                        ((double *)&stack0xffffffffffffffd8,
                         *(double *)(in_RDI + 8) -
                         ((auVar2._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)),&local_30);
  }
  return local_8;
}

Assistant:

inline TARGET_TYPE Extract(const INPUT_TYPE *dest, Vector &result) const {
		if (CRN == FRN) {
			return CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
		} else {
			auto lo = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[0], result);
			auto hi = CastInterpolation::Cast<INPUT_TYPE, TARGET_TYPE>(dest[1], result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}